

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_collider.cpp
# Opt level: O3

bool embree::sse2::intersect_triangle_triangle
               (Scene *scene0,uint geomID0,uint primID0,Scene *scene1,uint geomID1,uint primID1)

{
  undefined8 *puVar1;
  ulong uVar2;
  uint uVar3;
  Geometry *pGVar4;
  Geometry *pGVar5;
  long lVar6;
  long lVar7;
  RTCFilterFunctionN p_Var8;
  uint uVar9;
  long lVar10;
  uint uVar11;
  long lVar12;
  int iVar13;
  uint uVar14;
  uint uVar15;
  undefined8 in_R10;
  bool bVar16;
  bool bVar17;
  uint uVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  Vec3fa b2;
  Vec3fa b1;
  Vec3fa b0;
  Vec3fa a2;
  Vec3fa a1;
  Vec3fa a0;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_68;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_58;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_48;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_38;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_28;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_18;
  
  bVar16 = scene0 == scene1;
  bVar17 = geomID0 == geomID1;
  if ((!bVar17 || !bVar16) || primID0 != primID1) {
    pGVar4 = (scene0->geometries).items[geomID0].ptr;
    pGVar5 = (scene1->geometries).items[geomID1].ptr;
    lVar12 = (ulong)primID1 *
             pGVar5[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    lVar6 = *(long *)&pGVar5->field_0x58;
    lVar10 = (ulong)primID0 *
             pGVar4[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    lVar7 = *(long *)&pGVar4->field_0x58;
    uVar3 = *(uint *)(lVar7 + lVar10);
    uVar2 = *(ulong *)(lVar7 + 4 + lVar10);
    uVar11 = (uint)uVar2;
    uVar18 = (uint)(uVar2 >> 0x20);
    if (!bVar17 || !bVar16) {
      uVar9 = *(uint *)(lVar6 + lVar12);
      uVar14 = *(uint *)(lVar6 + 4 + lVar12);
      uVar15 = *(uint *)(lVar6 + 8 + lVar12);
LAB_00ba1f5f:
      lVar6 = *(long *)&pGVar4[1].time_range.upper;
      p_Var8 = pGVar4[1].intersectionFilterN;
      puVar1 = (undefined8 *)(lVar6 + (ulong)uVar3 * (long)p_Var8);
      local_18._0_8_ = *puVar1;
      local_18._8_8_ = puVar1[1];
      puVar1 = (undefined8 *)(lVar6 + (uVar2 & 0xffffffff) * (long)p_Var8);
      local_28._0_8_ = *puVar1;
      local_28._8_8_ = puVar1[1];
      puVar1 = (undefined8 *)(lVar6 + (ulong)uVar18 * (long)p_Var8);
      local_38._0_8_ = *puVar1;
      local_38._8_8_ = puVar1[1];
      lVar6 = *(long *)&pGVar5[1].time_range.upper;
      p_Var8 = pGVar5[1].intersectionFilterN;
      puVar1 = (undefined8 *)(lVar6 + (ulong)uVar9 * (long)p_Var8);
      local_48._0_8_ = *puVar1;
      local_48._8_8_ = puVar1[1];
      puVar1 = (undefined8 *)(lVar6 + (ulong)uVar14 * (long)p_Var8);
      local_58._0_8_ = *puVar1;
      local_58._8_8_ = puVar1[1];
      puVar1 = (undefined8 *)(lVar6 + (ulong)uVar15 * (long)p_Var8);
      local_68._0_8_ = *puVar1;
      local_68._8_8_ = puVar1[1];
      bVar16 = TriangleTriangleIntersector::intersect_triangle_triangle
                         ((Vec3fa *)&local_18.field_1,(Vec3fa *)&local_28.field_1,
                          (Vec3fa *)&local_38.field_1,(Vec3fa *)&local_48.field_1,
                          (Vec3fa *)&local_58.field_1,(Vec3fa *)&local_68.field_1);
      return bVar16;
    }
    uVar9 = *(uint *)(lVar6 + lVar12);
    auVar19._0_4_ = -(uint)(uVar9 == uVar3);
    auVar19._4_4_ = -(uint)(uVar9 == uVar11);
    auVar19._8_4_ = -(uint)(uVar9 == uVar18);
    auVar19._12_4_ = -(uint)(uVar9 == uVar18);
    iVar13 = movmskps((int)lVar7,auVar19);
    if (iVar13 == 0) {
      uVar14 = *(uint *)(lVar6 + 4 + lVar12);
      auVar20._0_4_ = -(uint)(uVar14 == uVar3);
      auVar20._4_4_ = -(uint)(uVar14 == uVar11);
      auVar20._8_4_ = -(uint)(uVar14 == uVar18);
      auVar20._12_4_ = -(uint)(uVar14 == uVar18);
      iVar13 = movmskps((int)CONCAT71((int7)((ulong)in_R10 >> 8),bVar17 && bVar16),auVar20);
      if (iVar13 == 0) {
        uVar15 = *(uint *)(lVar6 + 8 + lVar12);
        auVar21._0_4_ = -(uint)(uVar15 == uVar3);
        auVar21._4_4_ = -(uint)(uVar15 == uVar11);
        auVar21._8_4_ = -(uint)(uVar15 == uVar18);
        auVar21._12_4_ = -(uint)(uVar15 == uVar18);
        iVar13 = movmskps((int)lVar12,auVar21);
        if (iVar13 == 0) goto LAB_00ba1f5f;
      }
    }
  }
  return false;
}

Assistant:

bool intersect_triangle_triangle (Scene* scene0, unsigned geomID0, unsigned primID0, Scene* scene1, unsigned geomID1, unsigned primID1)
    {
      CSTAT(bvh_collide_prim_intersections1++);
      const TriangleMesh* mesh0 = scene0->get<TriangleMesh>(geomID0);
      const TriangleMesh* mesh1 = scene1->get<TriangleMesh>(geomID1);
      const TriangleMesh::Triangle& tri0 = mesh0->triangle(primID0);
      const TriangleMesh::Triangle& tri1 = mesh1->triangle(primID1);
      
      /* special culling for scene intersection with itself */
      if (scene0 == scene1 && geomID0 == geomID1)
      {
        /* ignore self intersections */
        if (primID0 == primID1)
          return false;
      }
      CSTAT(bvh_collide_prim_intersections2++);
      
      if (scene0 == scene1 && geomID0 == geomID1)
      {
        /* ignore intersection with topological neighbors */
        const vint4 t0(tri0.v[0],tri0.v[1],tri0.v[2],tri0.v[2]);
        if (any(vint4(tri1.v[0]) == t0)) return false;
        if (any(vint4(tri1.v[1]) == t0)) return false;
        if (any(vint4(tri1.v[2]) == t0)) return false;
      }
      CSTAT(bvh_collide_prim_intersections3++);
      
      const Vec3fa a0 = mesh0->vertex(tri0.v[0]);
      const Vec3fa a1 = mesh0->vertex(tri0.v[1]);
      const Vec3fa a2 = mesh0->vertex(tri0.v[2]);
      const Vec3fa b0 = mesh1->vertex(tri1.v[0]);
      const Vec3fa b1 = mesh1->vertex(tri1.v[1]);
      const Vec3fa b2 = mesh1->vertex(tri1.v[2]);
      
      return TriangleTriangleIntersector::intersect_triangle_triangle(a0,a1,a2,b0,b1,b2);
    }